

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O1

StringRef llvm::sys::getHostCPUName(void)

{
  uint *puVar1;
  uint *puVar2;
  long lVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_t *psVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  undefined *puVar14;
  undefined **ppuVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  bool bVar20;
  bool bVar21;
  uint in_XCR0;
  uint in_register_00000604;
  StringRef SVar22;
  StringRef SVar23;
  
  puVar1 = (uint *)cpuid_basic_info(0);
  uVar5 = *puVar1;
  if (uVar5 == 0) {
    SVar22.Length = 7;
    SVar22.Data = "generic";
    return SVar22;
  }
  puVar2 = (uint *)cpuid_Version_info(1);
  uVar16 = *puVar2;
  uVar13 = puVar2[2];
  uVar6 = puVar2[3];
  uVar19 = uVar16 >> 8 & 0xf;
  uVar18 = uVar16 >> 4 & 0xf;
  if (uVar19 == 6) {
LAB_00153dbf:
    uVar18 = uVar18 | uVar16 >> 0xc & 0xf0;
  }
  else if (uVar19 == 0xf) {
    uVar19 = (uVar16 >> 0x14 & 0xff) + 0xf;
    goto LAB_00153dbf;
  }
  uVar17 = uVar13 >> 0x16 & 0x1a | uVar6 >> 0xc & 0x180 | uVar6 >> 3 & 0x40 | (uVar6 & 1) << 5;
  uVar16 = 0;
  if ((~uVar6 & 0x18000000) == 0) {
    bVar20 = (~in_XCR0 & 6) == 0;
    bVar21 = (~in_XCR0 & 0xe0) == 0;
    uVar13 = in_register_00000604;
  }
  else {
    bVar21 = false;
    bVar20 = false;
  }
  bVar21 = (bool)(bVar21 & bVar20);
  uVar8 = uVar17 + 0x200;
  if (!bVar20) {
    uVar8 = uVar17;
  }
  uVar12 = uVar6;
  if (6 < uVar5) {
    lVar3 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar16 = *(uint *)(lVar3 + 4);
    uVar13 = *(uint *)(lVar3 + 8);
    uVar12 = *(uint *)(lVar3 + 0xc);
  }
  uVar10 = uVar17 + 0x600;
  if (!bVar20) {
    uVar10 = uVar17;
  }
  if ((uVar16 & 0x20) == 0) {
    uVar10 = uVar8;
  }
  if (uVar5 < 7) {
    uVar10 = uVar8;
  }
  uVar17 = uVar10 | 0x1000000;
  if (!bVar21) {
    uVar17 = uVar10;
  }
  if ((uVar16 >> 0x1b & 1) == 0) {
    uVar17 = uVar10;
  }
  uVar10 = uVar17;
  if (uVar5 < 7) {
    uVar10 = uVar8;
  }
  uVar7 = uVar10 | 0x100000;
  if (!bVar21) {
    uVar7 = uVar10;
  }
  if ((uVar16 & 0x50000000) == 0) {
    uVar10 = uVar17;
  }
  if ((int)uVar16 < 0) {
    uVar10 = uVar7;
  }
  uVar17 = uVar10;
  if (uVar5 < 7) {
    uVar17 = uVar8;
  }
  uVar7 = uVar17 | 0x4000000;
  if (!bVar21) {
    uVar7 = uVar17;
  }
  if ((uVar12 & 2) == 0) {
    uVar7 = uVar10;
  }
  uVar17 = uVar7;
  if (uVar5 < 7) {
    uVar17 = uVar8;
  }
  if ((uVar13 & 0xc) == 0 && (uVar12 & 0x4000) == 0) {
    uVar17 = uVar7;
  }
  if (uVar5 < 7) {
    uVar17 = uVar8;
  }
  puVar4 = (uint *)cpuid(0x80000000);
  uVar13 = puVar4[2];
  if (0x80000000 < *puVar4) {
    lVar3 = cpuid(0x80000001);
    uVar13 = *(uint *)(lVar3 + 8);
  }
  uVar16 = uVar16 >> 0x14 & 8 | uVar16 >> 0x12 & 2 | uVar16 >> 0x19 & 0x10;
  if (uVar5 < 7) {
    uVar16 = 0;
  }
  uVar5 = uVar13 >> 0x1b & 4;
  if (*puVar4 < 0x80000001) {
    uVar5 = 0;
  }
  if (puVar1[1] == 0x68747541) {
    switch(uVar19) {
    case 4:
      uVar19 = 0x18;
      break;
    case 5:
      uVar18 = uVar18 - 6;
      uVar19 = 0x19;
      if (uVar18 < 8) {
        puVar14 = &DAT_001a1eb0;
LAB_00154110:
        uVar13 = *(uint *)(puVar14 + (ulong)uVar18 * 4);
        goto LAB_00153f8f;
      }
      break;
    case 6:
      bVar20 = (uVar17 & 8) == 0;
      iVar11 = 0x1b;
      goto LAB_00154132;
    default:
      goto switchD_00153ff3_caseD_7;
    case 0xf:
      bVar20 = (uVar17 & 0x20) == 0;
      iVar11 = 0x1d;
LAB_00154132:
      uVar19 = iVar11 - (uint)bVar20;
      break;
    case 0x10:
      uVar18 = uVar18 - 2;
      uVar19 = 4;
      if (uVar18 < 7) {
        puVar14 = &DAT_001a1470;
        goto LAB_00154110;
      }
      break;
    case 0x14:
      uVar19 = 8;
      break;
    case 0x15:
      uVar13 = 10;
      uVar19 = 5;
      if ((uVar18 & 0xffffffe0) == 0x60) goto LAB_00153f8f;
      uVar13 = 9;
      if (((uVar18 & 0xfffffff0) == 0x30) ||
         (uVar13 = 8, uVar18 == 2 || (uVar18 & 0xfffffff0) == 0x10)) goto LAB_00153f8f;
      bVar20 = uVar18 < 0x10;
      uVar13 = 7;
      uVar19 = 5;
      goto LAB_001540d4;
    case 0x16:
      uVar19 = 9;
      break;
    case 0x17:
      uVar13 = 0xb;
      uVar19 = 10;
      goto LAB_00153f8f;
    }
    goto LAB_00153f8d;
  }
  if ((puVar1[1] != 0x756e6547) || ((char)puVar2[1] != '\0')) {
switchD_00153ff3_caseD_7:
    uVar19 = 0;
    goto LAB_00153f8d;
  }
  switch(uVar19) {
  case 3:
    uVar19 = 0xc;
    goto LAB_00153f8d;
  case 4:
    uVar19 = 0xd;
    goto LAB_00153f8d;
  case 5:
    bVar20 = (uVar17 & 2) == 0;
    iVar11 = 0xf;
    goto LAB_00154132;
  case 6:
    break;
  default:
    if (uVar19 != 0xf) goto switchD_00153ff3_caseD_7;
    uVar19 = 0x16;
    if (uVar5 == 0) {
      uVar19 = (uVar17 & 0x20) >> 3 | 0x13;
    }
    goto LAB_00153f8d;
  }
  switch(uVar18) {
  case 1:
    uVar19 = 0x10;
    break;
  case 2:
  case 4:
  case 0xc:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x18:
  case 0x19:
  case 0x1b:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x28:
  case 0x29:
  case 0x2b:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x38:
  case 0x39:
  case 0x3b:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x48:
  case 0x49:
  case 0x4b:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x58:
  case 0x59:
  case 0x5b:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x7b:
  case 0x7c:
  case 0x7d:
  case 0x7e:
  case 0x7f:
  case 0x80:
  case 0x81:
  case 0x82:
  case 0x83:
  case 0x84:
    goto switchD_00154153_caseD_2;
  case 3:
  case 5:
  case 6:
    uVar19 = 0x11;
    break;
  case 7:
  case 8:
  case 10:
  case 0xb:
    uVar19 = 0x12;
    break;
  case 9:
  case 0xd:
  case 0x15:
    uVar19 = 0x14;
    break;
  case 0xe:
    uVar19 = 0x15;
    break;
  case 0xf:
  case 0x16:
    uVar13 = 0x12;
    goto LAB_001541f0;
  case 0x17:
  case 0x1d:
    uVar13 = 0x13;
LAB_001541f0:
    uVar19 = 2;
    goto LAB_00153f8f;
  case 0x1a:
  case 0x1e:
  case 0x1f:
  case 0x2e:
    uVar13 = 1;
    goto LAB_00154327;
  case 0x1c:
  case 0x26:
  case 0x27:
  case 0x35:
  case 0x36:
    uVar19 = 1;
    break;
  case 0x25:
  case 0x2c:
  case 0x2f:
    uVar13 = 2;
    goto LAB_00154327;
  case 0x2a:
  case 0x2d:
    uVar19 = 3;
    uVar13 = 3;
    goto LAB_00153f8f;
  case 0x37:
  case 0x4a:
  case 0x4c:
  case 0x4d:
  case 0x5a:
  case 0x5d:
    uVar19 = 6;
    break;
  case 0x3a:
  case 0x3e:
    uVar13 = 0xc;
    goto LAB_00154327;
  case 0x3c:
  case 0x3f:
  case 0x45:
  case 0x46:
    uVar13 = 0xd;
    goto LAB_00154327;
  case 0x3d:
  case 0x47:
  case 0x4f:
  case 0x56:
    uVar13 = 0xe;
    goto LAB_00154327;
  case 0x4e:
  case 0x5e:
switchD_00154153_caseD_4e:
    uVar13 = 0xf;
    goto LAB_00154327;
  case 0x55:
    uVar13 = 0x10;
    goto LAB_00154327;
  case 0x57:
    goto switchD_00154153_caseD_57;
  case 0x5c:
  case 0x5f:
    uVar19 = 0x1e;
    break;
  case 0x66:
    uVar13 = 0x11;
LAB_00154327:
    uVar19 = 3;
    goto LAB_00153f8f;
  case 0x7a:
    uVar19 = 0x1f;
    break;
  case 0x85:
    uVar19 = 0xb;
    break;
  default:
    if ((uVar18 == 0x8e) || (uVar18 == 0x9e)) goto switchD_00154153_caseD_4e;
switchD_00154153_caseD_2:
    uVar13 = 0x11;
    uVar19 = 3;
    if ((uVar17 >> 0x1a != 0) || (uVar13 = 0x10, (uVar17 >> 0x14 & 1) != 0)) goto LAB_00153f8f;
    if ((uVar17 >> 0x18 & 1) == 0) {
      if ((uVar16 & 8) != 0) {
        bVar20 = uVar16 < 0x10;
        uVar19 = 0x1e;
        if (bVar20) {
          uVar19 = 3;
        }
        uVar13 = 0xf;
LAB_001540d4:
        if (!bVar20) {
          uVar13 = 0;
        }
        goto LAB_00153f8f;
      }
      uVar13 = 0xe;
      if ((((uVar16 & 2) != 0) || (uVar13 = 0xd, (uVar17 >> 10 & 1) != 0)) ||
         (uVar13 = 3, (uVar17 >> 9 & 1) != 0)) goto LAB_00153f8f;
      uVar16 = uVar6 >> 0x16 & 1;
      if ((uVar17 >> 8 & 1) != 0) {
        uVar19 = uVar16 * 3 + 3;
        uVar13 = uVar16 ^ 1;
        goto LAB_00153f8f;
      }
      uVar13 = 0x13;
      uVar19 = 2;
      if ((char)uVar17 < '\0') goto LAB_00153f8f;
      if ((uVar17 & 0x40) != 0) {
        uVar13 = 0x12;
        if (uVar16 != 0) {
          uVar13 = 0;
        }
        uVar19 = (uVar16 == 0) + 1;
        goto LAB_00153f8f;
      }
      uVar13 = 0x12;
      if (uVar5 != 0) goto LAB_00153f8f;
      uVar19 = 0x15;
      if ((((uVar17 & 0x20) == 0) && (uVar19 = 0x14, (uVar17 & 0x10) == 0)) &&
         (uVar19 = 0x12, (uVar17 & 8) == 0)) {
        bVar20 = (uVar17 & 2) == 0;
        iVar11 = 0x11;
        goto LAB_00154132;
      }
    }
    else {
switchD_00154153_caseD_57:
      uVar19 = 7;
    }
  }
LAB_00153f8d:
  uVar13 = 0;
LAB_00153f8f:
  uVar13 = uVar13 - 1;
  ppuVar15 = &PTR_anon_var_dwarf_1f4f0e_001d6c08 + uVar13;
  psVar9 = (size_t *)(&DAT_001a1490 + (ulong)uVar13 * 8);
  if (0x16 < uVar13) {
    ppuVar15 = &PTR_anon_var_dwarf_1a9ca7_001d6cc0 + uVar19;
    psVar9 = &DAT_001a1548 + uVar19;
  }
  SVar23.Length = *psVar9;
  SVar23.Data = *ppuVar15;
  return SVar23;
}

Assistant:

static bool getX86CpuIDAndInfo(unsigned value, unsigned *rEAX, unsigned *rEBX,
                               unsigned *rECX, unsigned *rEDX) {
#if defined(__GNUC__) || defined(__clang__)
#if defined(__x86_64__)
  // gcc doesn't know cpuid would clobber ebx/rbx. Preserve it manually.
  // FIXME: should we save this for Clang?
  __asm__("movq\t%%rbx, %%rsi\n\t"
          "cpuid\n\t"
          "xchgq\t%%rbx, %%rsi\n\t"
          : "=a"(*rEAX), "=S"(*rEBX), "=c"(*rECX), "=d"(*rEDX)
          : "a"(value));
  return false;
#elif defined(__i386__)
  __asm__("movl\t%%ebx, %%esi\n\t"
          "cpuid\n\t"
          "xchgl\t%%ebx, %%esi\n\t"
          : "=a"(*rEAX), "=S"(*rEBX), "=c"(*rECX), "=d"(*rEDX)
          : "a"(value));
  return false;
#else
  return true;
#endif
#elif defined(_MSC_VER)
  // The MSVC intrinsic is portable across x86 and x64.
  int registers[4];
  __cpuid(registers, value);
  *rEAX = registers[0];
  *rEBX = registers[1];
  *rECX = registers[2];
  *rEDX = registers[3];
  return false;
#else
  return true;
#endif
}